

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O0

int ztlex_isdecimal(ztlex_t *lex)

{
  int iVar1;
  ushort **ppuVar2;
  long in_RDI;
  int c;
  int i;
  int local_14;
  int local_4;
  
  iVar1 = (**(code **)(in_RDI + 0x238))(in_RDI);
  if (iVar1 == -1) {
    local_4 = -1;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[iVar1] & 0x800) == 0) {
      (**(code **)(in_RDI + 0x240))(iVar1,in_RDI);
      local_4 = 0;
    }
    else {
      local_14 = 1;
      *(char *)(in_RDI + 0x128) = (char)iVar1;
      iVar1 = (**(code **)(in_RDI + 0x238))(in_RDI);
      if (iVar1 == 0x2e) {
        local_14 = 2;
        *(undefined1 *)(in_RDI + 0x129) = 0x2e;
        iVar1 = (**(code **)(in_RDI + 0x238))(in_RDI);
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[iVar1] & 0x800) == 0) {
          if (iVar1 != -1) {
            (**(code **)(in_RDI + 0x240))(iVar1,in_RDI);
          }
        }
        else {
          local_14 = 3;
          *(char *)(in_RDI + 0x12a) = (char)iVar1;
          iVar1 = (**(code **)(in_RDI + 0x238))(in_RDI);
          ppuVar2 = __ctype_b_loc();
          if (((*ppuVar2)[iVar1] & 0x800) != 0) {
            *(char *)(in_RDI + 299) = (char)iVar1;
            *(undefined1 *)(in_RDI + 300) = 0;
            return 4;
          }
          if (iVar1 != -1) {
            (**(code **)(in_RDI + 0x240))(iVar1,in_RDI);
          }
        }
      }
      else if (iVar1 != -1) {
        (**(code **)(in_RDI + 0x240))(iVar1,in_RDI);
      }
      while (local_14 = local_14 + -1, -1 < local_14) {
        (**(code **)(in_RDI + 0x240))((int)*(char *)(in_RDI + 0x128 + (long)local_14),in_RDI);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ztlex_isdecimal(ztlex_t *lex)
{
  int i = 0;
  int c;

  c = lex->getC(lex);
  if (c == EOF)
    return EOF;

  if (!isdigit(c))
  {
    lex->ungetC(c, lex);
    return 0;
  }

  lex->lexeme[i++] = c;

  c = lex->getC(lex);
  if (c != '.') /* including EOF */
  {
    if (c != EOF)
      lex->ungetC(c, lex);
    goto undo;
  }

  lex->lexeme[i++] = c;

  c = lex->getC(lex);
  if (!isdigit(c)) /* including EOF */
  {
    if (c != EOF)
      lex->ungetC(c, lex);
    goto undo;
  }

  lex->lexeme[i++] = c;

  c = lex->getC(lex);
  if (!isdigit(c)) /* including EOF */
  {
    if (c != EOF)
      lex->ungetC(c, lex);
    goto undo;
  }

  lex->lexeme[i++] = c;

  lex->lexeme[i] = '\0';
  return i;

undo:
  while (--i >= 0)
    lex->ungetC(lex->lexeme[i], lex);
  return 0;
}